

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_verify_param(REF_GRID ref_grid)

{
  int iVar1;
  REF_MPI ref_mpi_00;
  REF_NODE pRVar2;
  REF_GEOM ref_geom_00;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL local_118;
  REF_DBL local_110;
  REF_DBL local_108;
  REF_DBL local_f0;
  REF_DBL local_e8;
  double local_d0;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL edge_constraint;
  REF_BOOL node_constraint;
  REF_DBL global_max;
  REF_DBL max_edge;
  REF_DBL max_node;
  REF_DBL max;
  REF_DBL dist;
  REF_DBL xyz [3];
  int local_34;
  REF_INT node;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  if (ref_geom_00->model == (void *)0x0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    max_node = 0.0;
    for (local_34 = 0; local_34 < ref_geom_00->max; local_34 = local_34 + 1) {
      if ((ref_geom_00->descr[local_34 * 6] == 0) &&
         (iVar1 = ref_geom_00->descr[local_34 * 6 + 5], ref_mpi_00->id == pRVar2->part[iVar1])) {
        uVar3 = ref_egads_eval(ref_geom_00,local_34,&dist,(REF_DBL *)0x0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x761,"ref_geom_verify_param",(ulong)uVar3,"eval xyz");
          return uVar3;
        }
        dVar4 = pow(dist - pRVar2->real[iVar1 * 0xf],2.0);
        dVar5 = pow(xyz[0] - pRVar2->real[iVar1 * 0xf + 1],2.0);
        dVar6 = pow(xyz[1] - pRVar2->real[iVar1 * 0xf + 2],2.0);
        max = sqrt(dVar4 + dVar5 + dVar6);
        local_d0 = max;
        if (max < max_node) {
          local_d0 = max_node;
        }
        max_node = local_d0;
      }
    }
    ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&max_node,&edge_constraint,3);
    if (ref_grid_local._4_4_ == 0) {
      max_node = _edge_constraint;
      if (ref_grid->mpi->id == 0) {
        printf("CAD topo node max eval dist %e\n",_edge_constraint);
      }
      max_node = 0.0;
      max_edge = 0.0;
      for (local_34 = 0; local_34 < ref_geom_00->max; local_34 = local_34 + 1) {
        if ((ref_geom_00->descr[local_34 * 6] == 1) &&
           (iVar1 = ref_geom_00->descr[local_34 * 6 + 5], ref_mpi_00->id == pRVar2->part[iVar1])) {
          uVar3 = ref_egads_eval(ref_geom_00,local_34,&dist,(REF_DBL *)0x0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x770,"ref_geom_verify_param",(ulong)uVar3,"eval xyz");
            return uVar3;
          }
          dVar4 = pow(dist - pRVar2->real[iVar1 * 0xf],2.0);
          dVar5 = pow(xyz[0] - pRVar2->real[iVar1 * 0xf + 1],2.0);
          dVar6 = pow(xyz[1] - pRVar2->real[iVar1 * 0xf + 2],2.0);
          max = sqrt(dVar4 + dVar5 + dVar6);
          uVar3 = ref_geom_is_a(ref_geom_00,iVar1,0,&ref_private_macro_code_rss);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x774,"ref_geom_verify_param",(ulong)uVar3,"n");
            return uVar3;
          }
          if (ref_private_macro_code_rss == 0) {
            if (max_node <= max) {
              local_f0 = max;
            }
            else {
              local_f0 = max_node;
            }
            max_node = local_f0;
          }
          else {
            if (max_edge <= max) {
              local_e8 = max;
            }
            else {
              local_e8 = max_edge;
            }
            max_edge = local_e8;
          }
        }
      }
      ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&max_node,&edge_constraint,3);
      if (ref_grid_local._4_4_ == 0) {
        max_node = _edge_constraint;
        if (ref_grid->mpi->id == 0) {
          printf("CAD topo edge max eval dist %e\n",_edge_constraint);
        }
        ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&max_edge,&edge_constraint,3);
        if (ref_grid_local._4_4_ == 0) {
          max_edge = _edge_constraint;
          if (ref_grid->mpi->id == 0) {
            printf("CAD topo edge node tol %e\n",_edge_constraint);
          }
          max_node = 0.0;
          max_edge = 0.0;
          global_max = 0.0;
          for (local_34 = 0; local_34 < ref_geom_00->max; local_34 = local_34 + 1) {
            if ((ref_geom_00->descr[local_34 * 6] == 2) &&
               (iVar1 = ref_geom_00->descr[local_34 * 6 + 5], ref_mpi_00->id == pRVar2->part[iVar1])
               ) {
              uVar3 = ref_egads_eval(ref_geom_00,local_34,&dist,(REF_DBL *)0x0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x789,"ref_geom_verify_param",(ulong)uVar3,"eval xyz");
                return uVar3;
              }
              dVar4 = pow(dist - pRVar2->real[iVar1 * 0xf],2.0);
              dVar5 = pow(xyz[0] - pRVar2->real[iVar1 * 0xf + 1],2.0);
              dVar6 = pow(xyz[1] - pRVar2->real[iVar1 * 0xf + 2],2.0);
              max = sqrt(dVar4 + dVar5 + dVar6);
              uVar3 = ref_geom_is_a(ref_geom_00,iVar1,0,&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x78d,"ref_geom_verify_param",(ulong)uVar3,"n");
                return uVar3;
              }
              uVar3 = ref_geom_is_a(ref_geom_00,iVar1,1,&ref_private_macro_code_rss_1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x78e,"ref_geom_verify_param",(ulong)uVar3,"n");
                return uVar3;
              }
              if (ref_private_macro_code_rss == 0) {
                if (ref_private_macro_code_rss_1 == 0) {
                  if (max_node <= max) {
                    local_118 = max;
                  }
                  else {
                    local_118 = max_node;
                  }
                  max_node = local_118;
                }
                else {
                  if (global_max <= max) {
                    local_110 = max;
                  }
                  else {
                    local_110 = global_max;
                  }
                  global_max = local_110;
                }
              }
              else {
                if (max_edge <= max) {
                  local_108 = max;
                }
                else {
                  local_108 = max_edge;
                }
                max_edge = local_108;
              }
            }
          }
          ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&max_node,&edge_constraint,3);
          if (ref_grid_local._4_4_ == 0) {
            max_node = _edge_constraint;
            if (ref_grid->mpi->id == 0) {
              printf("CAD topo face max eval dist %e\n",_edge_constraint);
            }
            ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&global_max,&edge_constraint,3);
            if (ref_grid_local._4_4_ == 0) {
              global_max = _edge_constraint;
              if (ref_grid->mpi->id == 0) {
                printf("CAD topo face edge tol %e\n",_edge_constraint);
              }
              ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&max_edge,&edge_constraint,3);
              if (ref_grid_local._4_4_ == 0) {
                max_edge = _edge_constraint;
                if (ref_grid->mpi->id == 0) {
                  printf("CAD topo face node tol %e\n",_edge_constraint);
                }
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x7a1,"ref_geom_verify_param",(ulong)ref_grid_local._4_4_,"mpi max edge");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x79d,"ref_geom_verify_param",(ulong)ref_grid_local._4_4_,"mpi max edge");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x799,"ref_geom_verify_param",(ulong)ref_grid_local._4_4_,"mpi max face");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x77f,"ref_geom_verify_param",(ulong)ref_grid_local._4_4_,"mpi max edge");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x77b,"ref_geom_verify_param",(ulong)ref_grid_local._4_4_,"mpi max edge");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x767,
             "ref_geom_verify_param",(ulong)ref_grid_local._4_4_,"mpi max node");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_param(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, max_node, max_edge, global_max;
  REF_BOOL node_constraint, edge_constraint;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo node max eval dist %e\n", max);

  max = 0.0;
  max_node = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      max = MAX(max, dist);
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge node tol %e\n", max_node);

  max = 0.0;
  max_node = 0.0;
  max_edge = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &edge_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      if (edge_constraint) {
        max_edge = MAX(max_edge, dist);
      } else {
        max = MAX(max, dist);
      }
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_edge, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_edge = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face edge tol %e\n", max_edge);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face node tol %e\n", max_node);

  return REF_SUCCESS;
}